

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

external_ip * __thiscall
libtorrent::aux::session_impl::external_address
          (external_ip *__return_storage_ptr__,session_impl *this)

{
  address_v6 *paVar1;
  undefined4 uVar2;
  pointer psVar3;
  element_type *peVar4;
  undefined4 uVar6;
  unsigned_long uVar5;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  address *a1;
  shared_ptr<libtorrent::aux::listen_socket_t> *i;
  pointer psVar10;
  bool bVar11;
  address local_addr;
  address ips [2] [2];
  address local_58;
  
  ips[1][1].ipv6_address_.addr_.__in6_u._8_8_ = 0;
  ips[1][1].ipv6_address_.scope_id_ = 0;
  ips[1][1].type_ = ipv4;
  ips[1][1].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  ips[1][1].ipv6_address_.addr_.__in6_u._0_8_ = 0;
  ips[1][0].ipv6_address_.addr_.__in6_u._8_8_ = 0;
  ips[1][0].ipv6_address_.scope_id_ = 0;
  ips[1][0].type_ = ipv4;
  ips[1][0].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  ips[1][0].ipv6_address_.addr_.__in6_u._0_8_ = 0;
  ips[0][1].ipv6_address_.addr_.__in6_u._8_8_ = 0;
  ips[0][1].ipv6_address_.scope_id_ = 0;
  ips[0][1].type_ = ipv4;
  ips[0][1].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  ips[0][1].ipv6_address_.addr_.__in6_u._0_8_ = 0;
  ips[0][0].ipv6_address_.addr_.__in6_u._8_8_ = 0;
  ips[0][0].ipv6_address_.scope_id_ = 0;
  ips[0][0].type_ = ipv4;
  ips[0][0].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  ips[0][0].ipv6_address_.addr_.__in6_u._0_8_ = 0;
  psVar3 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (this->m_listen_sockets).
                 super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar3; psVar10 = psVar10 + 1
      ) {
    peVar4 = (psVar10->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar2 = (peVar4->external_address).m_external_address.type_;
    uVar6 = (peVar4->external_address).m_external_address.ipv4_address_;
    uVar7 = *(undefined8 *)
             &(peVar4->external_address).m_external_address.ipv6_address_.addr_.__in6_u;
    uVar8 = *(undefined8 *)
             ((long)&(peVar4->external_address).m_external_address.ipv6_address_.addr_.__in6_u + 8);
    uVar5 = (peVar4->external_address).m_external_address.ipv6_address_.scope_id_;
    bVar11 = uVar2 == 1;
    a1 = ips[0] + bVar11;
    local_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_addr.ipv6_address_.scope_id_ = 0;
    local_addr.type_ = ipv4;
    local_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    bVar9 = boost::asio::ip::operator==(a1,&local_addr);
    if (bVar9) {
      a1->type_ = uVar2;
      a1->ipv4_address_ = (address_v4)uVar6;
      *(undefined8 *)&ips[0][bVar11].ipv6_address_.addr_.__in6_u = uVar7;
      *(undefined8 *)((long)&ips[0][bVar11].ipv6_address_.addr_.__in6_u + 8) = uVar8;
      ips[0][bVar11].ipv6_address_.scope_id_ = uVar5;
    }
    peVar4 = (psVar10->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar9 = (peVar4->local_endpoint).impl_.data_.base.sa_family != 2;
    if (bVar9) {
      local_addr.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(peVar4->local_endpoint).impl_.data_ + 8);
      local_addr.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(peVar4->local_endpoint).impl_.data_ + 0x10);
      local_addr.ipv6_address_.scope_id_ =
           (unsigned_long)(peVar4->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_addr.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(peVar4->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_addr.ipv6_address_.scope_id_ = 0;
    }
    local_addr.type_ = (uint)bVar9;
    bVar9 = is_local(&local_addr);
    local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_58.ipv6_address_.scope_id_ = 0;
    local_58.type_ = ipv4;
    local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    bVar9 = boost::asio::ip::operator==(ips[bVar9] + (local_addr.type_ == ipv6),&local_58);
    if (bVar9) {
      bVar9 = is_local(&local_addr);
      bVar11 = local_addr.type_ == ipv6;
      ips[bVar9][bVar11].type_ = local_addr.type_;
      ips[bVar9][bVar11].ipv4_address_ = (address_v4)local_addr.ipv4_address_.addr_.s_addr;
      paVar1 = &ips[bVar9][bVar11].ipv6_address_;
      *(undefined8 *)&(paVar1->addr_).__in6_u = local_addr.ipv6_address_.addr_.__in6_u._0_8_;
      *(undefined8 *)((long)&(paVar1->addr_).__in6_u + 8) =
           local_addr.ipv6_address_.addr_.__in6_u._8_8_;
      ips[bVar9][bVar11].ipv6_address_.scope_id_ = local_addr.ipv6_address_.scope_id_;
    }
  }
  external_ip::external_ip(__return_storage_ptr__,ips[1],ips[0],ips[1] + 1,ips[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

aux::external_ip session_impl::external_address() const
	{
		address ips[2][2];

		// take the first IP we find which matches each category
		for (auto const& i : m_listen_sockets)
		{
			address external_addr = i->external_address.external_address();
			if (ips[0][external_addr.is_v6()] == address())
				ips[0][external_addr.is_v6()] = external_addr;
			address local_addr = i->local_endpoint.address();
			if (ips[is_local(local_addr)][local_addr.is_v6()] == address())
				ips[is_local(local_addr)][local_addr.is_v6()] = local_addr;
		}

		return {ips[1][0], ips[0][0], ips[1][1], ips[0][1]};
	}